

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_master_table.c
# Opt level: O2

ion_dictionary_type_t ion_get_dictionary_type(ion_dictionary_id_t id)

{
  ion_err_t iVar1;
  ion_dictionary_config_info_t config;
  
  iVar1 = ion_lookup_in_master_table(id,&config);
  if (iVar1 != '\0') {
    config.dictionary_type = dictionary_type_error_t;
  }
  return config.dictionary_type;
}

Assistant:

ion_dictionary_type_t
ion_get_dictionary_type(
	ion_dictionary_id_t id
) {
	ion_err_t						err;
	ion_dictionary_config_info_t	config;

	err = ion_lookup_in_master_table(id, &config);

	if (err_ok != err) {
		return dictionary_type_error_t;
	}

	return config.dictionary_type;
}